

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

int kvtree_read_with_lock(char *file,kvtree *hash)

{
  int iVar1;
  ssize_t sVar2;
  
  iVar1 = kvtree_read_write_with_lock(file,hash,0);
  if (iVar1 < 0) {
    kvtree_err("Failed to open file with lock %s @ %s:%d",file,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
               ,0x618);
  }
  else {
    sVar2 = kvtree_read_fd(file,iVar1,hash);
    if ((int)sVar2 != -1) {
      iVar1 = kvtree_close_with_unlock(file,iVar1);
      return (uint)(iVar1 != 0);
    }
    kvtree_err("Couldn\'t read file @ %s:%d",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
               ,0x60a);
    kvtree_close_with_unlock(file,iVar1);
  }
  return 1;
}

Assistant:

int kvtree_read_with_lock(const char* file, kvtree* hash)
{
  int fd = kvtree_read_write_with_lock(file, hash, 0);
  if (fd >= 0) {
    int rc;
    /* read the file into the hash */
    rc = kvtree_read_fd(file, fd, hash);
    if (rc == -1) {
      kvtree_err("Couldn't read file @ %s:%d", __FILE__, __LINE__);
      kvtree_close_with_unlock(file, fd);
      return KVTREE_FAILURE;
    }

    /* close the file and release the lock */
    rc = kvtree_close_with_unlock(file, fd);
    if (rc != 0) {
      return KVTREE_FAILURE;
    }

    return KVTREE_SUCCESS;
  } else {
    kvtree_err("Failed to open file with lock %s @ %s:%d",
      file, __FILE__, __LINE__);
  }

  return KVTREE_FAILURE;
}